

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotIdInCachedScopeToNestedIndexArray
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *functionBody)

{
  uint32 uVar1;
  uint32 uVar2;
  AuxArray<unsigned_int> *pAVar3;
  uint i;
  ulong uVar4;
  
  pAVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)23,Js::AuxArray<unsigned_int>*>
                     ((FunctionProxy *)functionBody);
  uVar1 = PrependInt32(this,builder,L"SlotIdInCachedScopeToNestedIndexArray count",pAVar3->count,
                       (BufferBuilderInt32 **)0x0);
  for (uVar4 = 0; uVar4 < pAVar3->count; uVar4 = uVar4 + 1) {
    uVar2 = PrependInt32(this,builder,L"Nested function index for slot id in cached scope",
                         pAVar3[uVar4 + 1].count,(BufferBuilderInt32 **)0x0);
    uVar1 = uVar1 + uVar2;
  }
  return uVar1;
}

Assistant:

uint32 AddSlotIdInCachedScopeToNestedIndexArray(BufferBuilderList& builder, FunctionBody * functionBody)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotIdInCachedScopeToNestedIndexArray"), magicStartOfSlotIdToNestedIndexArray);
#endif

        Js::AuxArray<uint32> * slotIdToNestedIndexArray = functionBody->GetSlotIdInCachedScopeToNestedIndexArray();
        size += PrependInt32(builder, _u("SlotIdInCachedScopeToNestedIndexArray count"), slotIdToNestedIndexArray->count);
        for (uint i = 0; i < slotIdToNestedIndexArray->count; i++)
        {
            size += PrependInt32(builder, _u("Nested function index for slot id in cached scope"), slotIdToNestedIndexArray->elements[i]);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End magicStartOfSlotIdToNestedIndexArray"), magicEndOfSlotIdToNestedIndexArray);
#endif
        return size;
    }